

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

void recall_tree_ns::add_node_id_feature(recall_tree *b,uint32_t cn,example *ec)

{
  uint32_t uVar1;
  vw *pvVar2;
  ulong uVar3;
  uint64_t *puVar4;
  features *this;
  ulong uVar5;
  uint32_t *puVar6;
  bool bVar7;
  
  uVar5 = (ulong)cn;
  pvVar2 = b->all;
  bVar7 = (pvVar2->weights).sparse != false;
  puVar4 = &(pvVar2->weights).dense_weights._weight_mask;
  if (bVar7) {
    puVar4 = &(pvVar2->weights).sparse_weights._weight_mask;
  }
  uVar3 = *puVar4;
  puVar6 = &(pvVar2->weights).dense_weights._stride_shift;
  if (bVar7) {
    puVar6 = &(pvVar2->weights).sparse_weights._stride_shift;
  }
  uVar1 = *puVar6;
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&node_id_namespace);
  this = (ec->super_example_predict).feature_space + 0x88;
  if (b->node_only != false) {
    features::push_back(this,1.0,uVar5 * 0xd41a3 << ((byte)uVar1 & 0x3f) & uVar3);
    return;
  }
  for (; (int)uVar5 != 0; uVar5 = (ulong)(b->nodes)._begin[uVar5].parent) {
    features::push_back(this,1.0,uVar5 * 0xd41a3 << ((byte)uVar1 & 0x3f) & uVar3);
  }
  return;
}

Assistant:

void add_node_id_feature(recall_tree& b, uint32_t cn, example& ec)
{
  vw* all = b.all;
  uint64_t mask = all->weights.mask();
  size_t ss = all->weights.stride_shift();

  ec.indices.push_back(node_id_namespace);
  features& fs = ec.feature_space[node_id_namespace];

  if (b.node_only)
  {
    fs.push_back(1., (((uint64_t)868771 * cn) << ss) & mask);
  }
  else
  {
    while (cn > 0)
    {
      fs.push_back(1., (((uint64_t)868771 * cn) << ss) & mask);
      cn = b.nodes[cn].parent;
    }
  }

  // TODO: audit ?
  // TODO: if namespace already exists ?
}